

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

int PrepareNextRun(SUNContext sunctx,void *cvode_mem,int lmm,int miter,N_Vector y,SUNMatrix *A,
                  sunindextype mu,sunindextype ml,SUNLinearSolver *LS,SUNNonlinearSolver *NLS)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  SUNMatrix p_Var4;
  int in_ECX;
  char *funcname;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  long *in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int retval;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  int local_4;
  
  uVar5 = 0;
  if (y->content != (void *)0x0) {
    SUNNonlinSolFree(y->content);
  }
  if (*A != (SUNMatrix)0x0) {
    SUNLinSolFree(*A);
  }
  if (*in_R9 != 0) {
    SUNMatDestroy(*in_R9);
  }
  printf("\n\n-------------------------------------------------------------");
  printf("\n\nLinear Multistep Method : ");
  if (in_EDX == 1) {
    printf("ADAMS\n");
  }
  else {
    printf("BDF\n");
  }
  printf("Iteration               : ");
  if (in_ECX == 0) {
    printf("FIXEDPOINT\n");
    pvVar2 = (void *)SUNNonlinSol_FixedPoint(in_R8,0,in_RDI);
    y->content = pvVar2;
    iVar1 = check_retval((void *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0
                         ,in_stack_ffffffffffffffbc);
    if (iVar1 == 0) {
      local_4 = CVodeSetNonlinearSolver(in_RSI,y->content);
      iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    printf("NEWTON\n");
    pvVar2 = (void *)SUNNonlinSol_Newton(in_R8,in_RDI);
    y->content = pvVar2;
    iVar1 = check_retval((void *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0
                         ,in_stack_ffffffffffffffbc);
    if (iVar1 == 0) {
      local_4 = CVodeSetNonlinearSolver(in_RSI,y->content);
      iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (iVar1 == 0) {
        printf("Linear Solver           : ");
        funcname = (char *)(ulong)(in_ECX - 1);
        switch(funcname) {
        case (char *)0x0:
          printf("Dense, User-Supplied Jacobian\n");
          lVar3 = SUNDenseMatrix(2,2,in_RDI);
          *in_R9 = lVar3;
          iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                               in_stack_ffffffffffffffbc);
          if (iVar1 == 0) {
            p_Var4 = (SUNMatrix)SUNLinSol_Dense(in_R8,*in_R9,in_RDI);
            *A = p_Var4;
            iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                 in_stack_ffffffffffffffbc);
            if (iVar1 == 0) {
              uVar5 = CVodeSetLinearSolver(in_RSI,*A,*in_R9);
              iVar1 = check_retval((void *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),funcname,
                                   in_stack_ffffffffffffffbc);
              if (iVar1 == 0) {
                local_4 = CVodeSetJacFn(in_RSI,Jac1);
                iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                     in_stack_ffffffffffffffbc);
                if (iVar1 != 0) {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
          break;
        case (char *)0x1:
          printf("Dense, Difference Quotient Jacobian\n");
          lVar3 = SUNDenseMatrix(2,2,in_RDI);
          *in_R9 = lVar3;
          iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                               in_stack_ffffffffffffffbc);
          if (iVar1 == 0) {
            p_Var4 = (SUNMatrix)SUNLinSol_Dense(in_R8,*in_R9,in_RDI);
            *A = p_Var4;
            iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                 in_stack_ffffffffffffffbc);
            if (iVar1 == 0) {
              uVar5 = CVodeSetLinearSolver(in_RSI,*A,*in_R9);
              iVar1 = check_retval((void *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),funcname,
                                   in_stack_ffffffffffffffbc);
              if (iVar1 == 0) {
                local_4 = CVodeSetJacFn(in_RSI,0);
                iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                     in_stack_ffffffffffffffbc);
                if (iVar1 != 0) {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
          break;
        case (char *)0x2:
          printf("Diagonal Jacobian\n");
          local_4 = CVDiag(in_RSI);
          iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                               in_stack_ffffffffffffffbc);
          if (iVar1 != 0) {
            local_4 = 1;
          }
          break;
        case (char *)0x3:
          printf("Band, User-Supplied Jacobian\n");
          lVar3 = SUNBandMatrix(0x19,in_stack_00000008,in_stack_00000010,in_RDI);
          *in_R9 = lVar3;
          iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                               in_stack_ffffffffffffffbc);
          if (iVar1 == 0) {
            p_Var4 = (SUNMatrix)SUNLinSol_Band(in_R8,*in_R9,in_RDI);
            *A = p_Var4;
            iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                 in_stack_ffffffffffffffbc);
            if (iVar1 == 0) {
              uVar5 = CVodeSetLinearSolver(in_RSI,*A,*in_R9);
              iVar1 = check_retval((void *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),funcname,
                                   in_stack_ffffffffffffffbc);
              if (iVar1 == 0) {
                local_4 = CVodeSetJacFn(in_RSI,Jac2);
                iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                     in_stack_ffffffffffffffbc);
                if (iVar1 != 0) {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
          break;
        case (char *)0x4:
          printf("Band, Difference Quotient Jacobian\n");
          lVar3 = SUNBandMatrix(0x19,in_stack_00000008,in_stack_00000010,in_RDI);
          *in_R9 = lVar3;
          iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                               in_stack_ffffffffffffffbc);
          if (iVar1 == 0) {
            p_Var4 = (SUNMatrix)SUNLinSol_Band(in_R8,*in_R9,in_RDI);
            *A = p_Var4;
            iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                 in_stack_ffffffffffffffbc);
            if (iVar1 == 0) {
              uVar5 = CVodeSetLinearSolver(in_RSI,*A,*in_R9);
              iVar1 = check_retval((void *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),funcname,
                                   in_stack_ffffffffffffffbc);
              if (iVar1 == 0) {
                local_4 = CVodeSetJacFn(in_RSI,0);
                iVar1 = check_retval((void *)CONCAT44(local_4,in_stack_ffffffffffffffc8),funcname,
                                     in_stack_ffffffffffffffbc);
                if (iVar1 != 0) {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int PrepareNextRun(SUNContext sunctx, void* cvode_mem, int lmm,
                          int miter, N_Vector y, SUNMatrix* A, sunindextype mu,
                          sunindextype ml, SUNLinearSolver* LS,
                          SUNNonlinearSolver* NLS)
{
  int retval = CV_SUCCESS;

  if (*NLS) { SUNNonlinSolFree(*NLS); }
  if (*LS) { SUNLinSolFree(*LS); }
  if (*A) { SUNMatDestroy(*A); }

  printf("\n\n-------------------------------------------------------------");

  printf("\n\nLinear Multistep Method : ");
  if (lmm == CV_ADAMS) { printf("ADAMS\n"); }
  else { printf("BDF\n"); }

  printf("Iteration               : ");
  if (miter == FUNC)
  {
    printf("FIXEDPOINT\n");

    /* create fixed point nonlinear solver object */
    *NLS = SUNNonlinSol_FixedPoint(y, 0, sunctx);
    if (check_retval((void*)*NLS, "SUNNonlinSol_FixedPoint", 0)) { return (1); }

    /* attach nonlinear solver object to CVode */
    retval = CVodeSetNonlinearSolver(cvode_mem, *NLS);
    if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }
  }
  else
  {
    printf("NEWTON\n");

    /* create Newton nonlinear solver object */
    *NLS = SUNNonlinSol_Newton(y, sunctx);
    if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

    /* attach nonlinear solver object to CVode */
    retval = CVodeSetNonlinearSolver(cvode_mem, *NLS);
    if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }

    printf("Linear Solver           : ");

    switch (miter)
    {
    case DENSE_USER:
      printf("Dense, User-Supplied Jacobian\n");

      /* Create dense SUNMatrix for use in linear solves */
      *A = SUNDenseMatrix(P1_NEQ, P1_NEQ, sunctx);
      if (check_retval((void*)*A, "SUNDenseMatrix", 0)) { return (1); }

      /* Create dense SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Dense(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Dense", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Set the user-supplied Jacobian routine Jac */
      retval = CVodeSetJacFn(cvode_mem, Jac1);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case DENSE_DQ:
      printf("Dense, Difference Quotient Jacobian\n");

      /* Create dense SUNMatrix for use in linear solves */
      *A = SUNDenseMatrix(P1_NEQ, P1_NEQ, sunctx);
      if (check_retval((void*)*A, "SUNDenseMatrix", 0)) { return (1); }

      /* Create dense SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Dense(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Dense", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Use a difference quotient Jacobian */
      retval = CVodeSetJacFn(cvode_mem, NULL);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case DIAG:
      printf("Diagonal Jacobian\n");

      /* Call CVDiag to create/attach the CVODE-specific diagonal solver */
      retval = CVDiag(cvode_mem);
      if (check_retval(&retval, "CVDiag", 1)) { return (1); }
      break;

    case BAND_USER:
      printf("Band, User-Supplied Jacobian\n");

      /* Create band SUNMatrix for use in linear solves */
      *A = SUNBandMatrix(P2_NEQ, mu, ml, sunctx);
      if (check_retval((void*)*A, "SUNBandMatrix", 0)) { return (1); }

      /* Create banded SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Band(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Band", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Set the user-supplied Jacobian routine Jac */
      retval = CVodeSetJacFn(cvode_mem, Jac2);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;

    case BAND_DQ:
      printf("Band, Difference Quotient Jacobian\n");

      /* Create band SUNMatrix for use in linear solves */
      *A = SUNBandMatrix(P2_NEQ, mu, ml, sunctx);
      if (check_retval((void*)*A, "SUNBandMatrix", 0)) { return (1); }

      /* Create banded SUNLinearSolver object for use by CVode */
      *LS = SUNLinSol_Band(y, *A, sunctx);
      if (check_retval((void*)*LS, "SUNLinSol_Band", 0)) { return (1); }

      /* Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode */
      retval = CVodeSetLinearSolver(cvode_mem, *LS, *A);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

      /* Use a difference quotient Jacobian */
      retval = CVodeSetJacFn(cvode_mem, NULL);
      if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }
      break;
    }
  }

  return (retval);
}